

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,ImWchar c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ushort uVar5;
  ulong uVar6;
  undefined6 in_register_0000000a;
  uint col_00;
  ImFontGlyph *pIVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [64];
  undefined8 in_XMM1_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  
  auVar10._4_60_ = in_register_00001204;
  auVar10._0_4_ = size;
  uVar6 = CONCAT62(in_register_0000000a,c) & 0xffffffff;
  if ((uVar6 < (ulong)(long)(this->IndexLookup).Size) &&
     (uVar5 = (this->IndexLookup).Data[uVar6], uVar5 != 0xffff)) {
    pIVar7 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar5 * 0x28);
  }
  else {
    pIVar7 = this->FallbackGlyph;
  }
  if ((pIVar7 != (ImFontGlyph *)0x0) &&
     (((undefined1  [40])*pIVar7 & (undefined1  [40])0x2) != (undefined1  [40])0x0)) {
    col_00 = col | 0xffffff;
    if (((undefined1  [40])*pIVar7 & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
      col_00 = col;
    }
    auVar11._0_4_ = size / this->FontSize;
    auVar11._4_12_ = in_register_00001204._0_12_;
    auVar9 = vcmpss_avx(ZEXT816(0) << 0x40,auVar10._0_16_,6);
    auVar13._8_4_ = 0x3f800000;
    auVar13._0_8_ = 0x3f8000003f800000;
    auVar13._12_4_ = 0x3f800000;
    auVar9 = vblendvps_avx(auVar11,auVar13,auVar9);
    ImDrawList::PrimReserve(draw_list,6,4);
    local_48 = pos.x;
    fStack_44 = pos.y;
    fStack_40 = (float)in_XMM1_Qb;
    fStack_3c = (float)((ulong)in_XMM1_Qb >> 0x20);
    auVar8._0_4_ = (int)local_48;
    auVar8._4_4_ = (int)fStack_44;
    auVar8._8_4_ = (int)fStack_40;
    auVar8._12_4_ = (int)fStack_3c;
    auVar8 = vcvtdq2ps_avx(auVar8);
    uVar1 = pIVar7->X0;
    uVar3 = pIVar7->Y0;
    local_58 = auVar9._0_4_;
    auVar12._0_4_ = (float)uVar1 * local_58 + auVar8._0_4_;
    auVar12._4_4_ = (float)uVar3 * local_58 + auVar8._4_4_;
    auVar12._8_4_ = local_58 * 0.0 + auVar8._8_4_;
    auVar12._12_4_ = local_58 * 0.0 + auVar8._12_4_;
    local_20 = (ImVec2)vmovlps_avx(auVar12);
    uVar2 = pIVar7->X1;
    uVar4 = pIVar7->Y1;
    auVar9._0_4_ = (float)uVar2 * local_58 + auVar8._0_4_;
    auVar9._4_4_ = (float)uVar4 * local_58 + auVar8._4_4_;
    auVar9._8_4_ = local_58 * 0.0 + auVar8._8_4_;
    auVar9._12_4_ = local_58 * 0.0 + auVar8._12_4_;
    local_28 = (ImVec2)vmovlps_avx(auVar9);
    local_30.x = pIVar7->U0;
    local_30.y = pIVar7->V0;
    local_38.x = pIVar7->U1;
    local_38.y = pIVar7->V1;
    ImDrawList::PrimRectUV(draw_list,&local_20,&local_28,&local_30,&local_38,col_00);
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, ImWchar c) const
{
    const ImFontGlyph* glyph = FindGlyph(c);
    if (!glyph || !glyph->Visible)
        return;
    if (glyph->Colored)
        col |= ~IM_COL32_A_MASK;
    float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
    pos.x = IM_FLOOR(pos.x);
    pos.y = IM_FLOOR(pos.y);
    draw_list->PrimReserve(6, 4);
    draw_list->PrimRectUV(ImVec2(pos.x + glyph->X0 * scale, pos.y + glyph->Y0 * scale), ImVec2(pos.x + glyph->X1 * scale, pos.y + glyph->Y1 * scale), ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
}